

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::TiledOutputFile::initialize(TiledOutputFile *this,Header *header)

{
  int maxX;
  int minY;
  int maxY;
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  LevelMode LVar4;
  LevelRoundingMode LVar5;
  bool bVar6;
  int iVar7;
  Format FVar8;
  LineOrder *pLVar9;
  TileDescription *pTVar10;
  Box2i *pBVar11;
  size_t sVar12;
  TileBuffer *pTVar13;
  Compression *pCVar14;
  Compressor *pCVar15;
  char *pcVar16;
  pointer ppTVar17;
  ArgExc *this_00;
  ulong uVar18;
  Data *pDVar19;
  TileOffsets local_70;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_48;
  
  Header::operator=(&this->_data->header,header);
  pLVar9 = Header::lineOrder(&this->_data->header);
  pDVar19 = this->_data;
  pDVar19->lineOrder = *pLVar9;
  pTVar10 = Header::tileDescription(&pDVar19->header);
  pDVar19 = this->_data;
  uVar1 = pTVar10->ySize;
  LVar4 = pTVar10->mode;
  LVar5 = pTVar10->roundingMode;
  (pDVar19->tileDesc).xSize = pTVar10->xSize;
  (pDVar19->tileDesc).ySize = uVar1;
  (pDVar19->tileDesc).mode = LVar4;
  (pDVar19->tileDesc).roundingMode = LVar5;
  bVar6 = Header::hasType(&this->_data->header);
  if (bVar6) {
    Header::setType(&this->_data->header,(string *)&TILEDIMAGE_abi_cxx11_);
  }
  pBVar11 = Header::dataWindow(&this->_data->header);
  iVar7 = (pBVar11->min).x;
  pDVar19 = this->_data;
  pDVar19->minX = iVar7;
  maxX = (pBVar11->max).x;
  pDVar19->maxX = maxX;
  minY = (pBVar11->min).y;
  pDVar19->minY = minY;
  maxY = (pBVar11->max).y;
  pDVar19->maxY = maxY;
  precalculateTileInfo
            (&pDVar19->tileDesc,iVar7,maxX,minY,maxY,&pDVar19->numXTiles,&pDVar19->numYTiles,
             &pDVar19->numXLevels,&pDVar19->numYLevels);
  pDVar19 = this->_data;
  if (pDVar19->lineOrder == INCREASING_Y) {
    iVar7 = 0;
  }
  else {
    iVar7 = *pDVar19->numYTiles + -1;
  }
  (pDVar19->nextTileToWrite).dx = 0;
  (pDVar19->nextTileToWrite).dy = iVar7;
  (pDVar19->nextTileToWrite).lx = 0;
  (pDVar19->nextTileToWrite).ly = 0;
  sVar12 = calculateBytesPerPixel(&pDVar19->header);
  pDVar19 = this->_data;
  uVar1 = (pDVar19->tileDesc).ySize;
  sVar12 = (pDVar19->tileDesc).xSize * sVar12;
  pDVar19->maxBytesPerTileLine = sVar12;
  uVar18 = uVar1 * sVar12;
  pDVar19->tileBufferSize = uVar18;
  if (uVar18 < 0x80000000) {
    pDVar19 = this->_data;
    ppTVar17 = (pDVar19->tileBuffers).
               super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((pDVar19->tileBuffers).
        super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar17) {
      uVar18 = 0;
      do {
        pTVar13 = (TileBuffer *)operator_new(0x88);
        pCVar14 = Header::compression(&pDVar19->header);
        pDVar19 = this->_data;
        pCVar15 = newTileCompressor(*pCVar14,pDVar19->maxBytesPerTileLine,
                                    (ulong)(pDVar19->tileDesc).ySize,&pDVar19->header);
        *(undefined8 *)((long)&(pTVar13->buffer)._data + 4) = 0;
        *(undefined8 *)((long)&pTVar13->dataPtr + 4) = 0;
        (pTVar13->buffer)._size = 0;
        (pTVar13->buffer)._data = (char *)0x0;
        pTVar13->uncompressedSize = (uint64_t)pCVar15;
        pTVar13->compressor = (Compressor *)0x0;
        (pTVar13->sampleCountTableBuffer)._size = 0;
        *(undefined1 *)&(pTVar13->sampleCountTableBuffer)._data = 0;
        pTVar13->sampleCountTablePtr = (char *)&pTVar13->sampleCountTableCompressor;
        pTVar13->sampleCountTableSize = 0;
        *(undefined1 *)&pTVar13->sampleCountTableCompressor = 0;
        IlmThread_3_4::Semaphore::Semaphore((Semaphore *)&(pTVar13->tileCoord).lx,1);
        (this->_data->tileBuffers).
        super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar18] = pTVar13;
        uVar2 = this->_data->tileBufferSize;
        pTVar13 = (this->_data->tileBuffers).
                  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar18];
        pcVar16 = (char *)operator_new__(uVar2);
        pcVar3 = (pTVar13->buffer)._data;
        if (pcVar3 != (char *)0x0) {
          operator_delete__(pcVar3);
        }
        (pTVar13->buffer)._size = uVar2;
        (pTVar13->buffer)._data = pcVar16;
        uVar18 = uVar18 + 1;
        pDVar19 = this->_data;
        ppTVar17 = (pDVar19->tileBuffers).
                   super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar18 < (ulong)((long)(pDVar19->tileBuffers).
                                      super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar17 >>
                               3));
    }
    FVar8 = defaultFormat((Compressor *)(*ppTVar17)->uncompressedSize);
    pDVar19 = this->_data;
    pDVar19->format = FVar8;
    TileOffsets::TileOffsets
              (&local_70,(pDVar19->tileDesc).mode,pDVar19->numXLevels,pDVar19->numYLevels,
               pDVar19->numXTiles,pDVar19->numYTiles);
    pDVar19 = this->_data;
    (pDVar19->tileOffsets)._numYLevels = local_70._numYLevels;
    (pDVar19->tileOffsets)._mode = local_70._mode;
    (pDVar19->tileOffsets)._numXLevels = local_70._numXLevels;
    local_48.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pDVar19->tileOffsets)._offsets.
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pDVar19->tileOffsets)._offsets.
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pDVar19->tileOffsets)._offsets.
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pDVar19->tileOffsets)._offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_70._offsets.
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pDVar19->tileOffsets)._offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_70._offsets.
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pDVar19->tileOffsets)._offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_70._offsets.
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_70._offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_70._offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70._offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~vector(&local_48);
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~vector(&local_70._offsets);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Tile size too large for OpenEXR format");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TiledOutputFile::initialize (const Header& header)
{
    _data->header    = header;
    _data->lineOrder = _data->header.lineOrder ();

    //
    // Check that the file is indeed tiled
    //

    _data->tileDesc = _data->header.tileDescription ();

    //
    // 'Fix' the type attribute if it exists but is incorrectly set
    // (attribute is optional, but ensure it is correct if it exists)
    //
    if (_data->header.hasType ()) { _data->header.setType (TILEDIMAGE); }

    //
    // Save the dataWindow information
    //

    const Box2i& dataWindow = _data->header.dataWindow ();
    _data->minX             = dataWindow.min.x;
    _data->maxX             = dataWindow.max.x;
    _data->minY             = dataWindow.min.y;
    _data->maxY             = dataWindow.max.y;

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (
        _data->tileDesc,
        _data->minX,
        _data->maxX,
        _data->minY,
        _data->maxY,
        _data->numXTiles,
        _data->numYTiles,
        _data->numXLevels,
        _data->numYLevels);

    //
    // Determine the first tile coordinate that we will be writing
    // if the file is not RANDOM_Y.
    //

    _data->nextTileToWrite = (_data->lineOrder == INCREASING_Y)
                                 ? TileCoord (0, 0, 0, 0)
                                 : TileCoord (0, _data->numYTiles[0] - 1, 0, 0);

    _data->maxBytesPerTileLine =
        calculateBytesPerPixel (_data->header) * _data->tileDesc.xSize;

    _data->tileBufferSize = _data->maxBytesPerTileLine * _data->tileDesc.ySize;

    //
    // OpenEXR has a limit of INT_MAX compressed bytes per tile
    // disallow uncompressed tile sizes above INT_MAX too to guarantee file is written
    //
    if (_data->tileBufferSize > INT_MAX)
    {
        throw IEX_NAMESPACE::ArgExc ("Tile size too large for OpenEXR format");
    }

    //
    // Create all the TileBuffers and allocate their internal buffers
    //

    for (size_t i = 0; i < _data->tileBuffers.size (); i++)
    {
        _data->tileBuffers[i] = new TileBuffer (newTileCompressor (
            _data->header.compression (),
            _data->maxBytesPerTileLine,
            _data->tileDesc.ySize,
            _data->header));

        _data->tileBuffers[i]->buffer.resizeErase (_data->tileBufferSize);
    }

    _data->format = defaultFormat (_data->tileBuffers[0]->compressor);

    _data->tileOffsets = TileOffsets (
        _data->tileDesc.mode,
        _data->numXLevels,
        _data->numYLevels,
        _data->numXTiles,
        _data->numYTiles);
}